

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  uint uVar1;
  LogMessage *other;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  uint8_t *__dest;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (str->_M_string_length >> 0x20 != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x3b5);
    other = internal::LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: (str.size()) <= (std::numeric_limits<uint32_t>::max()): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  uVar3 = str->_M_string_length;
  *target = (byte)uVar3;
  if ((uint)uVar3 < 0x80) {
    __dest = target + 1;
  }
  else {
    *target = (byte)uVar3 | 0x80;
    uVar2 = uVar3 >> 7 & 0x1ffffff;
    target[1] = (uint8_t)uVar2;
    __dest = target + 2;
    if (0x3fff < (uint)uVar3) {
      uVar3 = (ulong)target[1];
      do {
        __dest[-1] = (byte)uVar3 | 0x80;
        uVar3 = uVar2 >> 7;
        *__dest = (uint8_t)uVar3;
        __dest = __dest + 1;
        uVar1 = (uint)uVar2;
        uVar2 = uVar3;
      } while (0x3fff < uVar1);
    }
  }
  __n = (size_t)(int)str->_M_string_length;
  memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  return __dest + __n;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  GOOGLE_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}